

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O0

void __thiscall
oout::TestResult::TestResult(TestResult *this,shared_ptr<const_oout::Result> *result)

{
  shared_ptr<const_oout::Result> *result_local;
  TestResult *this_local;
  
  Result::Result(&this->super_Result);
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__TestResult_003258f8;
  std::shared_ptr<const_oout::Result>::shared_ptr(&this->result,result);
  return;
}

Assistant:

TestResult::TestResult(const shared_ptr<const Result> &result)
	: result(result)
{
}